

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  void *pvVar8;
  parasail_result_t *ppVar9;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar49 [16];
  __m128i_64_t A_8;
  undefined1 auVar52 [16];
  ulong uVar54;
  undefined1 auVar53 [16];
  __m128i_64_t A_5;
  int64_t iVar56;
  undefined1 auVar55 [16];
  ulong uVar57;
  ulong uVar58;
  __m128i_64_t A_1;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  __m128i_64_t A_6;
  undefined1 auVar64 [16];
  ulong uVar65;
  __m128i_64_t A_2;
  ulong uVar66;
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  __m128i_64_t A_3;
  ulong uVar71;
  undefined1 auVar70 [16];
  ulong uVar72;
  __m128i_64_t A_4;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  long lVar79;
  __m128i_64_t A;
  ulong uVar80;
  long lVar81;
  ulong uVar82;
  undefined1 auVar83 [16];
  ulong uVar84;
  __m128i_64_t B;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  __m128i_64_t B_1;
  uint local_32c;
  uint local_318;
  undefined4 local_2d8;
  undefined1 local_298 [16];
  ulong local_288;
  ulong uStack_280;
  ulong local_268;
  ulong uStack_260;
  ulong uStack_250;
  ulong local_218;
  ulong uStack_210;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  undefined1 local_1e8 [16];
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  ulong uStack_110;
  ulong uStack_e0;
  ulong uVar36;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_diag_sse2_128_64_cold_8();
  }
  else {
    uVar18 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_nw_stats_rowcol_diag_sse2_128_64_cold_7();
    }
    else if (open < 0) {
      parasail_nw_stats_rowcol_diag_sse2_128_64_cold_6();
    }
    else {
      uVar21 = (ulong)(uint)gap;
      if (gap < 0) {
        parasail_nw_stats_rowcol_diag_sse2_128_64_cold_5();
      }
      else {
        uVar36 = (ulong)(uint)_s1Len;
        if (matrix == (parasail_matrix_t *)0x0) {
          parasail_nw_stats_rowcol_diag_sse2_128_64_cold_4();
        }
        else {
          if (matrix->type == 1) {
            if (_s1 == (char *)0x0) {
              parasail_nw_stats_rowcol_diag_sse2_128_64_cold_3();
              return (parasail_result_t *)0x0;
            }
          }
          else {
            if (_s1 == (char *)0x0) {
              parasail_nw_stats_rowcol_diag_sse2_128_64_cold_2();
              return (parasail_result_t *)0x0;
            }
            if (_s1Len < 1) {
              parasail_nw_stats_rowcol_diag_sse2_128_64_cold_1();
              return (parasail_result_t *)0x0;
            }
          }
          if (matrix->type != 0) {
            uVar36 = (ulong)(uint)matrix->length;
          }
          iVar24 = matrix->min;
          iVar23 = -open;
          uVar22 = 0x8000000000000000 - (long)iVar24;
          if (iVar24 != iVar23 && SBORROW4(iVar24,iVar23) == iVar24 + open < 0) {
            uVar22 = (ulong)(uint)open | 0x8000000000000000;
          }
          iVar24 = matrix->max;
          iVar29 = (int)uVar36;
          ppVar9 = parasail_result_new_rowcol3(iVar29,s2Len);
          if (ppVar9 != (parasail_result_t *)0x0) {
            ppVar9->flag = ppVar9->flag | 0x2851001;
            ptr = parasail_memalign_int64_t(0x10,(long)(iVar29 + 1));
            uVar10 = (ulong)(s2Len + 2);
            ptr_00 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_01 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_02 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_03 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_04 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_05 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_06 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_07 = parasail_memalign_int64_t(0x10,uVar10);
            ptr_08 = parasail_memalign_int64_t(0x10,uVar10);
            if ((ptr_08 != (int64_t *)0x0 &&
                (ptr_07 != (int64_t *)0x0 && (ptr_06 != (int64_t *)0x0 && ptr_05 != (int64_t *)0x0))
                ) && ((ptr_04 != (int64_t *)0x0 &&
                      (ptr_03 != (int64_t *)0x0 && ptr_02 != (int64_t *)0x0)) &&
                     ((ptr_01 != (int64_t *)0x0 && ptr_00 != (int64_t *)0x0) &&
                     ptr != (int64_t *)0x0))) {
              uVar10 = uVar22 + 1;
              lVar32 = 0x7ffffffffffffffe - (long)iVar24;
              uStack_280 = (ulong)iVar23;
              local_288 = (ulong)(iVar23 - gap);
              if (0 < iVar29) {
                piVar4 = matrix->mapper;
                uVar25 = 0;
                do {
                  ptr[uVar25] = (long)piVar4[(byte)_s1[uVar25]];
                  uVar25 = uVar25 + 1;
                } while (uVar36 != uVar25);
              }
              local_318 = iVar29 - 1;
              local_32c = s2Len - 1;
              auVar64._8_4_ = (int)uVar10;
              auVar64._0_8_ = uVar10;
              auVar64._12_4_ = (int)(uVar10 >> 0x20);
              local_1e8._8_4_ = (int)lVar32;
              local_1e8._0_8_ = lVar32;
              local_1e8._12_4_ = (int)((ulong)lVar32 >> 0x20);
              lVar1 = (long)iVar29 + -1;
              ptr[iVar29] = 0;
              piVar4 = matrix->mapper;
              uVar25 = 1;
              if (1 < s2Len) {
                uVar25 = uVar18;
              }
              uVar26 = 0;
              do {
                ptr_00[uVar26 + 1] = (long)piVar4[(byte)_s2[uVar26]];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
              *ptr_00 = 0;
              ptr_00[uVar18 + 1] = 0;
              lVar27 = 0;
              uVar26 = uStack_280;
              do {
                *(ulong *)((long)ptr_01 + lVar27 + 8) = uVar26;
                *(undefined8 *)((long)ptr_02 + lVar27 + 8) = 0;
                *(undefined8 *)((long)ptr_03 + lVar27 + 8) = 0;
                *(undefined8 *)((long)ptr_04 + lVar27 + 8) = 0;
                *(ulong *)((long)ptr_05 + lVar27 + 8) = uVar10;
                *(undefined8 *)((long)ptr_06 + lVar27 + 8) = 0;
                *(undefined8 *)((long)ptr_07 + lVar27 + 8) = 0;
                *(undefined8 *)((long)ptr_08 + lVar27 + 8) = 0;
                uVar26 = uVar26 - uVar21;
                lVar27 = lVar27 + 8;
              } while (uVar25 * 8 != lVar27);
              *ptr_01 = 0;
              *ptr_02 = 0;
              *ptr_03 = 0;
              *ptr_04 = 0;
              *ptr_05 = 0;
              *ptr_06 = 0;
              *ptr_07 = 0;
              *ptr_08 = 0;
              ptr_01[uVar18 + 1] = 0;
              ptr_02[uVar18 + 1] = 0;
              ptr_03[uVar18 + 1] = 0;
              ptr_04[uVar18 + 1] = 0;
              ptr_05[uVar18 + 1] = 0;
              ptr_06[uVar18 + 1] = 0;
              ptr_07[uVar18 + 1] = 0;
              ptr_08[uVar18 + 1] = 0;
              *ptr_01 = 0;
              uStack_200 = auVar64._8_8_;
              local_218 = uVar10;
              local_1f8 = uVar10;
              uVar25 = uVar10;
              uVar26 = uStack_200;
              uVar72 = uVar10;
              uVar73 = uStack_200;
              uVar69 = uVar10;
              uVar71 = uStack_200;
              if (iVar29 < 1) {
                uStack_210 = uStack_200;
                uStack_1f0 = uStack_200;
              }
              else {
                piVar4 = matrix->matrix;
                uVar11 = (ulong)local_32c;
                auVar52 = ZEXT416(1);
                uStack_1f0 = uStack_200;
                uStack_210 = uStack_200;
                uVar33 = 0;
                do {
                  uVar5 = ptr[uVar33];
                  lVar27 = ptr[uVar33 + 1];
                  uVar39 = uVar33 | 1;
                  uVar15 = local_318;
                  if (uVar39 < uVar36) {
                    uVar15 = (uint)uVar33 | 1;
                  }
                  bVar41 = matrix->type == 0;
                  iVar24 = matrix->size;
                  uVar12 = uVar33;
                  if (bVar41) {
                    uVar12 = uVar5;
                  }
                  lVar16 = (long)(int)uVar15;
                  if (bVar41) {
                    lVar16 = lVar27;
                  }
                  uVar2 = uVar33 + 2;
                  iVar56 = *ptr_01;
                  *ptr_01 = (long)iVar23 - uVar2 * uVar21;
                  lVar46 = auVar52._8_8_;
                  uVar84 = 0;
                  local_298 = (undefined1  [16])0x0;
                  uVar17 = 0;
                  lVar79 = -1;
                  lVar81 = 0;
                  uStack_250 = 0;
                  uVar54 = 0;
                  uVar47 = 0;
                  uVar78 = 0;
                  uVar80 = 0;
                  uVar66 = 0;
                  uVar68 = 0;
                  uVar75 = 0;
                  uVar77 = 0;
                  local_268 = 0;
                  uStack_260 = 0;
                  uVar48 = 0;
                  uVar74 = 0;
                  local_148 = 0;
                  uStack_140 = 0;
                  local_138 = 0;
                  uStack_130 = 0;
                  local_128 = 0;
                  uStack_120 = 0;
                  auVar83 = auVar64;
                  uVar58 = 0;
                  uVar59 = 0;
                  uVar62 = 0;
                  uVar85 = (long)iVar23 - uVar33 * uVar21;
                  uVar50 = uVar10;
                  uVar57 = uVar10;
                  do {
                    uVar87 = uVar62;
                    uVar76 = uVar59;
                    lVar3 = ptr_01[uVar17 + 1];
                    uVar62 = uVar85 - (uint)open;
                    uVar65 = lVar3 - (ulong)(uint)open;
                    uStack_e0 = (ulong)(uint)gap;
                    uVar57 = uVar57 - uVar21;
                    uVar59 = ptr_05[uVar17 + 1] - uStack_e0;
                    uVar37 = uVar57;
                    if ((long)uVar57 < (long)uVar62) {
                      uVar37 = uVar62;
                    }
                    uVar62 = -(ulong)((long)uVar57 < (long)uVar62);
                    uVar57 = uVar59;
                    if ((long)uVar59 < (long)uVar65) {
                      uVar57 = uVar65;
                    }
                    uVar59 = -(ulong)((long)uVar59 < (long)uVar65);
                    uVar84 = uVar84 - (uint)open;
                    uVar86 = uVar85 - (uint)open;
                    uVar47 = uVar47 - uVar21;
                    uVar50 = uVar50 - uStack_e0;
                    uVar65 = uVar47;
                    if ((long)uVar47 < (long)uVar84) {
                      uVar65 = uVar84;
                    }
                    uVar47 = -(ulong)((long)uVar47 < (long)uVar84);
                    uVar34 = uVar50;
                    if ((long)uVar50 < (long)uVar86) {
                      uVar34 = uVar86;
                    }
                    uVar6 = ptr_00[uVar17 + 1];
                    lVar28 = (long)piVar4[uVar12 * (long)iVar24 + uVar6];
                    lVar19 = (long)piVar4[lVar16 * iVar24 + ptr_00[uVar17]];
                    uVar58 = lVar19 + uVar58;
                    uVar60 = lVar28 + iVar56;
                    uVar84 = -(ulong)((long)uVar50 < (long)uVar86);
                    uVar50 = uVar65;
                    if ((long)uVar65 < (long)uVar58) {
                      uVar50 = uVar58;
                    }
                    uVar86 = uVar34;
                    if ((long)uVar34 < (long)uVar60) {
                      uVar86 = uVar60;
                    }
                    uVar30 = uVar37;
                    if ((long)uVar37 < (long)uVar50) {
                      uVar30 = uVar50;
                    }
                    uVar13 = uVar57;
                    if ((long)uVar57 < (long)uVar86) {
                      uVar13 = uVar86;
                    }
                    uVar31 = -(ulong)(uVar30 == uVar58);
                    uVar20 = -(ulong)(uVar13 == uVar60);
                    uVar50 = -(ulong)((long)uVar50 <= (long)uVar37);
                    auVar83._0_8_ = auVar83._8_8_;
                    uVar38 = -(ulong)((long)uVar86 <= (long)uVar57);
                    uVar51 = (uVar5 == uVar6) + uStack_120;
                    uStack_120 = ptr_02[uVar17 + 1];
                    uVar61 = (0 < lVar28) + uStack_130;
                    uStack_130 = ptr_03[uVar17 + 1];
                    uVar60 = uStack_260;
                    uVar86 = ptr_04[uVar17 + 1];
                    uVar82 = uVar62 & uVar76 | ~uVar62 & uVar54;
                    uVar54 = uVar59 & uStack_120 | ~uVar59 & ptr_06[uVar17 + 1];
                    uVar63 = uVar62 & uVar87 | ~uVar62 & uStack_250;
                    uStack_250 = uVar59 & uStack_130 | ~uVar59 & ptr_07[uVar17 + 1];
                    uVar75 = uVar74 & uVar47 | ~uVar47 & uVar75;
                    uVar77 = uVar76 & uVar84 | ~uVar84 & uVar77;
                    uVar66 = uVar48 & uVar47 | ~uVar47 & uVar66;
                    uVar68 = uVar87 & uVar84 | ~uVar84 & uVar68;
                    auVar67._8_4_ = 0xffffffff;
                    auVar67._0_8_ = 0xffffffffffffffff;
                    auVar67._12_4_ = 0xffffffff;
                    local_298._0_8_ =
                         (uVar62 & uStack_260 | ~uVar62 & CONCAT44(local_298._4_4_,local_298._8_4_))
                         + 1;
                    local_298._8_8_ =
                         (uVar59 & uVar86 | ~uVar59 & ptr_08[uVar17 + 1]) - auVar67._8_8_;
                    uVar78 = (uVar47 & local_268 | ~uVar47 & uVar78) + 1;
                    uVar80 = (uVar84 & uStack_260 | ~uVar84 & uVar80) - auVar67._8_8_;
                    auVar70._8_4_ = 0xffffffff;
                    auVar70._0_8_ = 0xffffffffffffffff;
                    auVar70._12_4_ = 0xffffffff;
                    uVar58 = -(ulong)(lVar79 == -1);
                    uVar14 = -(ulong)(lVar81 == -1);
                    uVar84 = uVar58 & local_288 | ~uVar58 & uVar30;
                    uVar30 = uVar14 & uStack_280 | ~uVar14 & uVar13;
                    uVar74 = ~uVar58 & ((lVar27 == auVar83._0_8_) + local_128 & uVar31 |
                                       ~uVar31 & (uVar50 & uVar82 | ~uVar50 & uVar75));
                    uVar59 = ~uVar14 & (uVar51 & uVar20 |
                                       ~uVar20 & (uVar38 & uVar54 | ~uVar38 & uVar77));
                    uVar48 = ~uVar58 & ((0 < lVar19) + local_138 & uVar31 |
                                       ~uVar31 & (uVar50 & uVar63 | ~uVar50 & uVar66));
                    uVar62 = ~uVar14 & (uVar61 & uVar20 |
                                       ~uVar20 & (uVar38 & uStack_250 | ~uVar38 & uVar68));
                    local_268 = ~uVar58 & (local_148 + 1 & uVar31 |
                                          ~uVar31 & (uVar50 & local_298._0_8_ | ~uVar50 & uVar78));
                    uStack_260 = ~uVar14 & (uStack_140 - auVar70._8_8_ & uVar20 |
                                           ~uVar20 & (uVar38 & local_298._8_8_ | ~uVar38 & uVar80));
                    if (1 < uVar17) {
                      if ((long)uVar84 <= (long)local_1e8._0_8_) {
                        local_1e8._0_8_ = uVar84;
                      }
                      if ((long)uVar30 <= (long)local_1e8._8_8_) {
                        local_1e8._8_8_ = uVar30;
                      }
                      uVar47 = uVar84;
                      if ((long)uVar84 < (long)local_218) {
                        uVar47 = local_218;
                      }
                      uVar50 = uVar30;
                      if ((long)uVar30 < (long)uStack_210) {
                        uVar50 = uStack_210;
                      }
                      if ((long)uVar47 <= (long)uVar74) {
                        uVar47 = uVar74;
                      }
                      if ((long)uVar50 <= (long)uVar59) {
                        uVar50 = uVar59;
                      }
                      if ((long)uVar47 <= (long)uVar48) {
                        uVar47 = uVar48;
                      }
                      if ((long)uVar50 <= (long)uVar62) {
                        uVar50 = uVar62;
                      }
                      local_218 = uVar47;
                      if ((long)uVar47 <= (long)local_268) {
                        local_218 = local_268;
                      }
                      uStack_210 = uVar50;
                      if ((long)uVar50 <= (long)uStack_260) {
                        uStack_210 = uStack_260;
                      }
                    }
                    bVar42 = uVar33 == local_318;
                    plVar7 = (long *)((ppVar9->field_4).trace)->trace_del_table;
                    lVar19 = *plVar7;
                    lVar28 = plVar7[4];
                    bVar41 = uVar17 < uVar18;
                    if (bVar41 && bVar42) {
                      *(int *)(lVar19 + uVar17 * 4) = (int)uVar30;
                    }
                    if (uVar11 == uVar17) {
                      *(int *)(lVar28 + uVar33 * 4) = (int)uVar30;
                    }
                    bVar43 = uVar39 == local_318;
                    bVar44 = uVar17 != 0;
                    if (bVar44 && bVar43) {
                      *(int *)(lVar19 + -4 + uVar17 * 4) = (int)uVar84;
                    }
                    bVar40 = uVar39 < uVar36;
                    bVar45 = uVar18 == uVar17;
                    if (bVar45 && bVar40) {
                      *(int *)(lVar28 + uVar39 * 4) = (int)uVar84;
                    }
                    pvVar8 = ((ppVar9->field_4).trace)->trace_del_table;
                    lVar19 = *(long *)((long)pvVar8 + 8);
                    lVar28 = *(long *)((long)pvVar8 + 0x28);
                    if (bVar41 && bVar42) {
                      *(int *)(lVar19 + uVar17 * 4) = (int)uVar59;
                    }
                    if (uVar11 == uVar17) {
                      *(int *)(lVar28 + uVar33 * 4) = (int)uVar59;
                    }
                    local_2d8 = (undefined4)uVar74;
                    if (bVar44 && bVar43) {
                      *(undefined4 *)(lVar19 + -4 + uVar17 * 4) = local_2d8;
                    }
                    if (bVar45 && bVar40) {
                      *(undefined4 *)(lVar28 + uVar39 * 4) = local_2d8;
                    }
                    pvVar8 = ((ppVar9->field_4).trace)->trace_del_table;
                    lVar19 = *(long *)((long)pvVar8 + 0x10);
                    lVar28 = *(long *)((long)pvVar8 + 0x30);
                    if (bVar41 && bVar42) {
                      *(int *)(lVar19 + uVar17 * 4) = (int)uVar62;
                    }
                    if (uVar11 == uVar17) {
                      *(int *)(lVar28 + uVar33 * 4) = (int)uVar62;
                    }
                    if (bVar44 && bVar43) {
                      *(int *)(lVar19 + -4 + uVar17 * 4) = (int)uVar48;
                    }
                    if (bVar45 && bVar40) {
                      *(int *)(lVar28 + uVar39 * 4) = (int)uVar48;
                    }
                    pvVar8 = ((ppVar9->field_4).trace)->trace_del_table;
                    lVar19 = *(long *)((long)pvVar8 + 0x18);
                    lVar28 = *(long *)((long)pvVar8 + 0x38);
                    if (bVar41 && bVar42) {
                      *(int *)(lVar19 + uVar17 * 4) = (int)uStack_260;
                    }
                    if (uVar11 == uVar17) {
                      *(int *)(lVar28 + uVar33 * 4) = (int)uStack_260;
                    }
                    if (bVar44 && bVar43) {
                      *(int *)(lVar19 + -4 + uVar17 * 4) = (int)local_268;
                    }
                    if (bVar45 && bVar40) {
                      *(int *)(lVar28 + uVar39 * 4) = (int)local_268;
                    }
                    auVar83._8_8_ = uVar6;
                    uVar47 = ~uVar58 & uVar65 | uVar58 & uVar10;
                    uVar50 = ~uVar14 & uVar34 | uVar14 & uStack_200;
                    uVar75 = ~uVar58 & uVar75;
                    uVar77 = ~uVar14 & uVar77;
                    uVar66 = ~uVar58 & uVar66;
                    uVar68 = ~uVar14 & uVar68;
                    uVar78 = ~uVar58 & uVar78;
                    uVar80 = ~uVar14 & uVar80;
                    uVar58 = -(ulong)(lVar79 == uVar18 - 1 && auVar52._0_8_ == lVar1);
                    uVar65 = -(ulong)(lVar81 == uVar18 - 1 && lVar46 == lVar1);
                    local_1f8 = uVar84 & uVar58 | ~uVar58 & local_1f8;
                    uStack_1f0 = uVar30 & uVar65 | ~uVar65 & uStack_1f0;
                    uVar72 = uVar74 & uVar58 | ~uVar58 & uVar72;
                    uVar73 = uVar59 & uVar65 | ~uVar65 & uVar73;
                    uVar69 = uVar48 & uVar58 | ~uVar58 & uVar69;
                    uVar71 = uVar62 & uVar65 | ~uVar65 & uVar71;
                    uVar25 = ~uVar58 & uVar25 | local_268 & uVar58;
                    uVar26 = ~uVar65 & uVar26 | uStack_260 & uVar65;
                    ptr_01[uVar17] = uVar84;
                    ptr_02[uVar17] = uVar74;
                    ptr_03[uVar17] = uVar48;
                    ptr_04[uVar17] = local_268;
                    ptr_05[uVar17] = uVar37;
                    ptr_06[uVar17] = uVar82;
                    ptr_07[uVar17] = uVar63;
                    ptr_08[uVar17] = local_298._0_8_;
                    auVar55._8_4_ = 0xffffffff;
                    auVar55._0_8_ = 0xffffffffffffffff;
                    auVar55._12_4_ = 0xffffffff;
                    lVar79 = lVar79 + 1;
                    lVar81 = lVar81 - auVar55._8_8_;
                    uVar17 = uVar17 + 1;
                    uVar58 = uVar85;
                    iVar56 = lVar3;
                    uVar85 = uVar30;
                    local_148 = uVar60;
                    uStack_140 = uVar86;
                    local_138 = uVar87;
                    local_128 = uVar76;
                  } while (s2Len + 1 != uVar17);
                  auVar52._0_8_ = auVar52._0_8_ + 2;
                  auVar52._8_8_ = lVar46 + 2;
                  uStack_110 = (ulong)(uint)(gap * 2);
                  local_288 = local_288 - (uint)(gap * 2);
                  uStack_280 = uStack_280 - uStack_110;
                  uVar33 = uVar2;
                } while (uVar2 < uVar36);
              }
              iVar24 = 1;
              uVar18 = uVar10;
              uVar21 = uVar10;
              uVar36 = uVar10;
              do {
                uVar33 = uVar69;
                uVar69 = uVar72;
                uVar72 = uVar25;
                uVar25 = local_1f8;
                if ((long)uVar21 < (long)uStack_1f0) {
                  uVar10 = uVar71;
                  uVar18 = uVar73;
                  uVar21 = uStack_1f0;
                  uVar36 = uVar26;
                }
                iVar35 = (int)uVar36;
                iVar23 = (int)uVar10;
                iVar29 = (int)uVar18;
                iVar24 = iVar24 + -1;
                local_1f8 = 0;
                uStack_1f0 = uVar25;
                uVar25 = 0;
                uVar26 = uVar72;
                uVar72 = 0;
                uVar73 = uVar69;
                uVar69 = 0;
                uVar71 = uVar33;
              } while (iVar24 == 0);
              auVar49._8_8_ = -(ulong)((long)local_1e8._8_8_ <= (long)uVar22);
              auVar49._0_8_ = -(ulong)((long)local_1e8._0_8_ <= (long)uVar22);
              auVar53._8_8_ = -(ulong)(lVar32 < (long)uStack_210);
              auVar53._0_8_ = -(ulong)(lVar32 < (long)local_218);
              auVar53 = auVar53 | auVar49;
              if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar53 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar53 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar53 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar53 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar53 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar53 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar53[0xf] < '\0') {
                *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                local_318 = 0;
                local_32c = 0;
                uVar21 = 0;
                iVar29 = 0;
                iVar23 = 0;
                iVar35 = 0;
              }
              ppVar9->score = (int)uVar21;
              ppVar9->end_query = local_318;
              ppVar9->end_ref = local_32c;
              ((ppVar9->field_4).stats)->matches = iVar29;
              ((ppVar9->field_4).stats)->similar = iVar23;
              ((ppVar9->field_4).stats)->length = iVar35;
              parasail_free(ptr_08);
              parasail_free(ptr_07);
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar9;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vNM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vNS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vWM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vWS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
            case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
            vWM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64_rpl(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64_rpl(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8_rpl(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8_rpl(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8_rpl(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}